

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall
pbrt::LightPathIntegrator::LightPathIntegrator
          (LightPathIntegrator *this,int maxDepth,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  undefined8 __p;
  undefined1 local_70 [40];
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_48;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  local_38.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_40.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_48.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)(local_70 + 0x10),
             lights);
  ImageTileIntegrator::ImageTileIntegrator
            (&this->super_ImageTileIntegrator,(CameraHandle *)&local_38,(SamplerHandle *)&local_40,
             (PrimitiveHandle *)&local_48,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)(local_70 + 0x10));
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
            ((_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
             (local_70 + 0x10));
  (this->super_ImageTileIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__LightPathIntegrator_02eeeaf8;
  this->maxDepth = maxDepth;
  (this->lightSampler)._M_t.
  super___uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>._M_t
  .super__Tuple_impl<0UL,_pbrt::PowerLightSampler_*,_std::default_delete<pbrt::PowerLightSampler>_>.
  super__Head_base<0UL,_pbrt::PowerLightSampler_*,_false>._M_head_impl = (PowerLightSampler *)0x0;
  local_70._8_8_ = pstd::pmr::new_delete_resource();
  std::
  make_unique<pbrt::PowerLightSampler,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,pstd::pmr::polymorphic_allocator<std::byte>>
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_70,
             (polymorphic_allocator<std::byte> *)lights);
  __p = local_70._0_8_;
  local_70._0_8_ =
       (__uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>)0x0;
  std::__uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>::
  reset((__uniq_ptr_impl<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_> *)
        &this->lightSampler,(pointer)__p);
  std::unique_ptr<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_>::
  ~unique_ptr((unique_ptr<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_> *)
              local_70);
  return;
}

Assistant:

LightPathIntegrator::LightPathIntegrator(int maxDepth, CameraHandle camera,
                                         SamplerHandle sampler, PrimitiveHandle aggregate,
                                         std::vector<LightHandle> lights)
    : ImageTileIntegrator(camera, sampler, aggregate, lights), maxDepth(maxDepth) {
    lightSampler = std::make_unique<PowerLightSampler>(lights, Allocator());
}